

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O2

void __thiscall libtorrent::mmap_disk_io::execute_job(mmap_disk_io *this,mmap_disk_job *j)

{
  jobqueue_t *jobs;
  error_code eVar1;
  jobqueue_t local_78;
  jobqueue_t local_58;
  jobqueue_t local_38;
  
  local_78.m_size = 0;
  local_78.m_first = (disk_job *)0x0;
  local_78.m_last = (disk_job *)0x0;
  if (((j->super_disk_job).flags.m_val & 0x40) == 0) {
    perform_job(this,j,&local_78);
    if (local_78.m_size == 0) {
      return;
    }
    jobs = &local_58;
    local_58.m_first = local_78.m_first;
    local_58.m_last = local_78.m_last;
  }
  else {
    (j->super_disk_job).ret.m_val = '\x01';
    eVar1 = boost::asio::error::make_error_code(operation_aborted);
    (j->super_disk_job).error.ec.val_ = eVar1.val_;
    (j->super_disk_job).error.ec.failed_ = eVar1.failed_;
    *(int3 *)&(j->super_disk_job).error.ec.field_0x5 = eVar1._5_3_;
    (j->super_disk_job).error.ec.cat_ = eVar1.cat_;
    *(undefined4 *)&(j->super_disk_job).error.field_0x10 = 0xffffff;
    aux::tailqueue<libtorrent::aux::disk_job>::push_back(&local_78,&j->super_disk_job);
    jobs = &local_38;
    local_38.m_first = local_78.m_first;
    local_38.m_last = local_78.m_last;
  }
  jobs->m_size = local_78.m_size;
  local_78.m_first = (disk_job *)0x0;
  local_78.m_last = (disk_job *)0x0;
  local_78.m_size = 0;
  add_completed_jobs(this,jobs);
  return;
}

Assistant:

void mmap_disk_io::execute_job(aux::mmap_disk_job* j)
	{
		jobqueue_t completed_jobs;
		if (j->flags & aux::disk_job::aborted)
		{
			j->ret = disk_status::fatal_disk_error;
			j->error = storage_error(boost::asio::error::operation_aborted);
			completed_jobs.push_back(j);
			add_completed_jobs(std::move(completed_jobs));
			return;
		}

		perform_job(j, completed_jobs);
		if (!completed_jobs.empty())
			add_completed_jobs(std::move(completed_jobs));
	}